

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O2

void __thiscall FR<8U>::FR(FR<8U> *this,int num,int _HIT)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  BitSet *this_00;
  Counter *__s;
  long lVar4;
  uint _LENGTH;
  Counter *pCVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  Abstract<8U>::Abstract(&this->super_Abstract<8U>);
  (this->super_Abstract<8U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111ae0;
  (this->super_Abstract<8U>).HIT = _HIT;
  this->SIZE = num / 0x11;
  _LENGTH = num / 0x11 << 3;
  this->LENGTH = _LENGTH;
  this->flow = 0;
  this_00 = (BitSet *)operator_new(0x10);
  BitSet::BitSet(this_00,_LENGTH);
  this->bitset = this_00;
  iVar1 = this->SIZE;
  lVar7 = (long)iVar1;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar7) {
    uVar6 = lVar7 << 4;
  }
  __s = (Counter *)operator_new__(uVar6);
  if (iVar1 != 0) {
    auVar8 = vpbroadcastq_avx512vl();
    lVar4 = 0;
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar2 = vpmovsxbd_avx(ZEXT416(0x30201000));
    pCVar5 = __s;
    do {
      auVar9 = vpbroadcastq_avx512vl();
      auVar9 = vpor_avx2(auVar9,auVar3);
      uVar6 = vpcmpuq_avx512vl(auVar9,auVar8,2);
      vpscatterdq_avx512vl
                (ZEXT832(pCVar5) + ZEXT1632(auVar2),uVar6 & 0xf,
                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      lVar4 = lVar4 + 4;
      pCVar5 = pCVar5 + 4;
    } while (((lVar7 + 0xfffffffffffffffU & 0xfffffffffffffff) -
             (ulong)((uint)(lVar7 + 0xfffffffffffffffU) & 3)) + 4 != lVar4);
  }
  this->counter = __s;
  memset(__s,0,lVar7 << 4);
  std::__cxx11::string::assign((char *)&(this->super_Abstract<8U>).name);
  std::__cxx11::string::assign((char *)&(this->super_Abstract<8U>).sep);
  return;
}

Assistant:

FR(int num, int _HIT) {
		this->HIT = _HIT;
		SIZE = num / 17;
		// SIZE = 118750 + 30000 * (num - 1);
		LENGTH = 8 * SIZE;
		// LENGTH = 800000 + 160000 * (num - 1);
		flow = 0;
		bitset = new BitSet(LENGTH);
		counter = new Counter[SIZE];
		memset(counter, 0, sizeof(Counter) * SIZE);
		this->name = "FR";
		this->sep = "\t\t\t";
	}